

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O2

void TestDisconnectConnection(void)

{
  pointer ppTVar1;
  TestB *this;
  size_t i;
  ulong uVar2;
  pointer ppTVar3;
  long lVar4;
  bool bVar5;
  TestB *pb;
  vector<TestB_*,_std::allocator<TestB_*>_> listeners;
  TestA ta;
  connection local_48;
  
  TestRunner::StartTest("TestDisconnectConnection");
  listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TestA::TestA(&ta);
  lVar4 = 1000;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    this = (TestB *)operator_new(0x50);
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->explicitConnectionA)._data.
    super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&this->dataA = 0;
    (this->explicitConnectionA)._vptr_connection = (_func_int **)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->sigB)._data.
    super___shared_ptr<lsignal::signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_slot)._vptr_slot = (_func_int **)0x0;
    (this->super_slot)._cleaners.
    super__Vector_base<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestB::TestB(this);
    pb = this;
    std::vector<TestB_*,_std::allocator<TestB_*>_>::push_back(&listeners,&pb);
    lsignal::signal<void(int)>::connect<TestB,TestB>(&local_48,&ta.sigA,pb,0x112762,(slot *)0x0);
    std::__shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pb->explicitConnectionA)._data.
                super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>,
               &local_48._data.
                super___shared_ptr<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2>);
    lsignal::connection::~connection(&local_48);
  }
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()(&ta.sigA,0x17);
  AssertHelper::VerifyValue(true,receiveSigACount == 1000,"Verify siga count1");
  for (uVar2 = 0; uVar2 < 1000; uVar2 = uVar2 + 2) {
    lsignal::connection::disconnect
              (&listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2]->explicitConnectionA);
  }
  receiveSigACount = 0;
  lsignal::signal<void_(int)>::operator()(&ta.sigA,0x22);
  AssertHelper::VerifyValue(true,receiveSigACount == 500,"Verify siga count/2");
  receiveSigACount = 0;
  for (lVar4 = 0; lVar4 != 1000; lVar4 = lVar4 + 1) {
    lsignal::connection::disconnect
              (&listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4]->explicitConnectionA);
  }
  lsignal::signal<void_(int)>::operator()(&ta.sigA,0x2d);
  AssertHelper::VerifyValue(true,receiveSigACount == 0,"Verify disconnect_all");
  ppTVar1 = listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar3 = listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1) {
    if (*ppTVar3 != (TestB *)0x0) {
      (*((*ppTVar3)->super_slot)._vptr_slot[1])();
    }
  }
  TestA::~TestA(&ta);
  std::_Vector_base<TestB_*,_std::allocator<TestB_*>_>::~_Vector_base
            (&listeners.super__Vector_base<TestB_*,_std::allocator<TestB_*>_>);
  return;
}

Assistant:

void TestDisconnectConnection()
{
	TestRunner::StartTest(MethodName);
	std::vector<TestB*> listeners;
	TestA ta;
	const size_t count = 1000;
	for (size_t i = 0; i < count; i++)
	{
		TestB* pb = new TestB();
		listeners.push_back(pb);
		pb->explicitConnectionA = ta.sigA.connect(pb, &TestB::ReceiveSigA, pb);
	}

	receiveSigACount = 0;
	ta.sigA(23);
	AssertHelper::VerifyValue(true, receiveSigACount == count, "Verify siga count1");

	for (size_t i = 0; i < count; i += 2)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	receiveSigACount = 0;
	ta.sigA(34);
	AssertHelper::VerifyValue(true, receiveSigACount == count / 2, "Verify siga count/2");

	receiveSigACount = 0;
	for (size_t i = 0; i < count; i++)
	{
		ta.sigA.disconnect(listeners[i]->explicitConnectionA);
	}

	ta.sigA(45);
	AssertHelper::VerifyValue(true, receiveSigACount == 0, "Verify disconnect_all");

	for (TestB* pb : listeners)
		delete pb;
}